

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_standard_tests.cpp
# Opt level: O2

void __thiscall
script_standard_tests::bip341_spk_test_vectors::test_method(bip341_spk_test_vectors *this)

{
  long lVar1;
  pointer pUVar2;
  uint uVar3;
  CScript *pCVar4;
  bool bVar5;
  UniValue *pUVar6;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar7;
  string *psVar8;
  string *psVar9;
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *__x;
  _Base_ptr p_Var10;
  size_t in_RCX;
  iterator in_R8;
  iterator pvVar11;
  string *in_R9;
  pointer this_00;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  string_view hex_str;
  Span<const_unsigned_char> vch;
  const_string file;
  Span<const_unsigned_char> s;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  Span<const_unsigned_char> s_00;
  const_string file_03;
  const_string file_04;
  string_view hex_str_00;
  initializer_list<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __l;
  check_type cVar12;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  allocator_type local_3a3;
  ShortestVectorFirstComparator local_3a2;
  allocator<char> local_3a1;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  allocator<char> local_2b9;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  function<void_(const_UniValue_&,_int)> parse_tree;
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_268;
  TaprootSpendData spend_data;
  string local_1c8;
  string local_1a8;
  undefined1 local_188 [8];
  bool bStack_180;
  undefined7 uStack_17f;
  undefined1 *local_178 [2];
  undefined1 local_168 [32];
  string local_148;
  map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
  scriptposes;
  TaprootBuilder spktest;
  UniValue tests;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tests.val._M_dataplus._M_p = (pointer)&tests.val.field_2;
  tests.val._M_string_length = 0;
  tests.val.field_2._M_local_buf[0] = '\0';
  tests.typ = VNULL;
  tests.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tests.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tests.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  UniValue::read(&tests,0x7270,json_tests::detail_bip341_wallet_vectors_bytes,in_RCX);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&spend_data,"scriptPubKey",(allocator<char> *)&spktest);
  pUVar6 = UniValue::operator[](&tests,(string *)&spend_data);
  std::__cxx11::string::~string((string *)&spend_data);
  pvVar7 = UniValue::getValues(pUVar6);
  pUVar2 = (pvVar7->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (pvVar7->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pUVar2; this_00 = this_00 + 1) {
    spktest.m_valid = true;
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    spktest.m_output_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    scriptposes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    scriptposes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    scriptposes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &scriptposes._M_t._M_impl.super__Rb_tree_header._M_header;
    scriptposes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    spktest.m_branch.
    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    spktest.m_internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    spktest.m_branch.
    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    spktest.m_branch.
    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parse_tree.super__Function_base._M_manager = (_Manager_type)0x0;
    parse_tree._M_invoker = (_Invoker_type)0x0;
    parse_tree.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    parse_tree.super__Function_base._M_functor._8_8_ = 0;
    scriptposes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         scriptposes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    parse_tree.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
    *(map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
      **)parse_tree.super__Function_base._M_functor._M_unused._0_8_ = &scriptposes;
    *(TaprootBuilder **)((long)parse_tree.super__Function_base._M_functor._M_unused._0_8_ + 8) =
         &spktest;
    *(function<void_(const_UniValue_&,_int)> **)
     ((long)parse_tree.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = &parse_tree;
    parse_tree._M_invoker =
         std::
         _Function_handler<void_(const_UniValue_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp:424:65)>
         ::_M_invoke;
    parse_tree.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_UniValue_&,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp:424:65)>
         ::_M_manager;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&spend_data,"given",(allocator<char> *)&local_148);
    pUVar6 = UniValue::operator[](this_00,(string *)&spend_data);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"scriptTree",(allocator<char> *)local_168);
    pUVar6 = UniValue::operator[](pUVar6,(string *)&local_268);
    std::function<void_(const_UniValue_&,_int)>::operator()(&parse_tree,pUVar6,0);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&spend_data);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"given",(allocator<char> *)local_188);
    pUVar6 = UniValue::operator[](this_00,(string *)&local_268);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"internalPubkey",(allocator<char> *)&local_1a8);
    pUVar6 = UniValue::operator[](pUVar6,&local_148);
    psVar8 = UniValue::get_str_abi_cxx11_(pUVar6);
    hex_str._M_str = (psVar8->_M_dataplus)._M_p;
    hex_str._M_len = psVar8->_M_string_length;
    ParseHex<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_168,hex_str);
    vch.m_size = local_168._8_8_ - local_168._0_8_;
    vch.m_data = (uchar *)local_168._0_8_;
    base_blob<256U>::base_blob((base_blob<256U> *)&spend_data,vch);
    TaprootBuilder::Finalize(&spktest,&spend_data.internal_key);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_168);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_268);
    local_298 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
    ;
    local_290 = "";
    local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = (iterator)in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x1b7;
    file.m_begin = (iterator)&local_298;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a8,msg);
    local_268._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    local_268._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
    local_268._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_268._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)((long)"\x05\x04\x03\x02\x01" + 5);
    local_2b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
    ;
    local_2b0 = "";
    TaprootBuilder::GetOutput((WitnessV1Taproot *)local_188,&spktest);
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._9_7_ = uStack_17f;
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = bStack_180;
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ = local_178[0];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_ = local_178[1];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = local_188[0];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = local_188[1];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = local_188[2];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = local_188[3];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = local_188[4];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = local_188[5];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = local_188[6];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = local_188[7];
    spend_data.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 6;
    GetScriptForDestination((CScript *)local_168,(CTxDestination *)&spend_data);
    uVar3 = local_168._28_4_ - 0x1d;
    pCVar4 = (CScript *)local_168._0_8_;
    if ((uint)local_168._28_4_ < 0x1d) {
      uVar3 = local_168._28_4_;
      pCVar4 = (CScript *)local_168;
    }
    s.m_size._0_4_ = uVar3;
    s.m_data = (uchar *)pCVar4;
    s.m_size._4_4_ = 0;
    HexStr_abi_cxx11_(&local_148,s);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"expected",(allocator<char> *)&local_3b8);
    pUVar6 = UniValue::operator[](this_00,&local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"scriptPubKey",&local_2b9);
    pUVar6 = UniValue::operator[](pUVar6,&local_1c8);
    psVar9 = UniValue::get_str_abi_cxx11_(pUVar6);
    pvVar11 = (iterator)0x2;
    psVar8 = &local_148;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_268,&local_2b8,0x1b7,1,2,psVar8,
               "HexStr(GetScriptForDestination(spktest.GetOutput()))",psVar9,
               "vec[\"expected\"][\"scriptPubKey\"].get_str()");
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_148);
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_168);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&spend_data);
    local_2d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
    ;
    local_2c8 = "";
    local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_00.m_end = (iterator)psVar8;
    msg_00.m_begin = pvVar11;
    file_00.m_end = (iterator)0x1b8;
    file_00.m_begin = (iterator)&local_2d0;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2e0,
               msg_00);
    local_268._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    local_268._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
    local_268._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_268._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)((long)"\x05\x04\x03\x02\x01" + 5);
    local_2f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
    ;
    local_2e8 = "";
    TaprootBuilder::GetOutput((WitnessV1Taproot *)local_168,&spktest);
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x10] = local_168[0x10];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x11] = local_168[0x11];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x12] = local_168[0x12];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x13] = local_168[0x13];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x14] = local_168[0x14];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x15] = local_168[0x15];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x16] = local_168[0x16];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0x17] = local_168[0x17];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0] = local_168[0];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[1] = local_168[1];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[2] = local_168[2];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[3] = local_168[3];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[4] = local_168[4];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[5] = local_168[5];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[6] = local_168[6];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[7] = local_168[7];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[8] = local_168[8];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[9] = local_168[9];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[10] = local_168[10];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xb] = local_168[0xb];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xc] = local_168[0xc];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xd] = local_168[0xd];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xe] = local_168[0xe];
    spend_data.internal_key.m_keydata.super_base_blob<256U>.m_data._M_elems[0xf] = local_168[0xf];
    spend_data.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = 6;
    EncodeDestination_abi_cxx11_(&local_148,(CTxDestination *)&spend_data);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_188,"expected",(allocator<char> *)&local_1c8);
    pUVar6 = UniValue::operator[](this_00,(string *)local_188);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"bip350Address",(allocator<char> *)&local_3b8);
    pUVar6 = UniValue::operator[](pUVar6,&local_1a8);
    psVar9 = UniValue::get_str_abi_cxx11_(pUVar6);
    pvVar11 = (iterator)0x2;
    psVar8 = &local_148;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&local_268,&local_2f0,0x1b8,1,2,psVar8,"EncodeDestination(spktest.GetOutput())",
               psVar9,"vec[\"expected\"][\"bip350Address\"].get_str()");
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string((string *)&local_148);
    std::__detail::__variant::
    _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                         *)&spend_data);
    TaprootBuilder::GetSpendData(&spend_data,&spktest);
    local_300 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
    ;
    local_2f8 = "";
    local_310 = &boost::unit_test::basic_cstring<char_const>::null;
    local_308 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_01.m_end = (iterator)psVar8;
    msg_01.m_begin = pvVar11;
    file_01.m_end = (iterator)0x1ba;
    file_01.m_begin = (iterator)&local_300;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_310,
               msg_01);
    local_268._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    local_268._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
    local_268._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_268._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)((long)"\x05\x04\x03\x02\x01" + 5);
    local_320 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
    ;
    local_318 = "";
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"intermediary",(allocator<char> *)&local_1a8);
    pUVar6 = UniValue::operator[](this_00,&local_148);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_168,"merkleRoot",(allocator<char> *)&local_1c8);
    pUVar6 = UniValue::operator[](pUVar6,(string *)local_168);
    local_188[0] = pUVar6->typ == VNULL;
    bVar5 = base_blob<256U>::IsNull(&spend_data.merkle_root.super_base_blob<256U>);
    local_3b8 = (char *)CONCAT71(local_3b8._1_7_,bVar5);
    pvVar11 = (iterator)0x2;
    psVar8 = (string *)local_188;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (&local_268,&local_320,0x1ba,1,2,psVar8,
               "vec[\"intermediary\"][\"merkleRoot\"].isNull()",&local_3b8,
               "spend_data.merkle_root.IsNull()");
    std::__cxx11::string::~string((string *)local_168);
    std::__cxx11::string::~string((string *)&local_148);
    bVar5 = base_blob<256U>::IsNull(&spend_data.merkle_root.super_base_blob<256U>);
    if (!bVar5) {
      local_330 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
      ;
      local_328 = "";
      local_340 = &boost::unit_test::basic_cstring<char_const>::null;
      local_338 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_02.m_end = (iterator)psVar8;
      msg_02.m_begin = pvVar11;
      file_02.m_end = (iterator)0x1bc;
      file_02.m_begin = (iterator)&local_330;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_340,
                 msg_02);
      local_268._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
      local_268._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
      local_268._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
      local_268._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)((long)"\x05\x04\x03\x02\x01" + 5);
      local_350 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
      ;
      local_348 = "";
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"intermediary",(allocator<char> *)&local_1a8);
      pUVar6 = UniValue::operator[](this_00,&local_148);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_168,"merkleRoot",(allocator<char> *)&local_1c8);
      pUVar6 = UniValue::operator[](pUVar6,(string *)local_168);
      psVar8 = UniValue::get_str_abi_cxx11_(pUVar6);
      s_00.m_size = 0x20;
      s_00.m_data = (uchar *)&spend_data.merkle_root;
      HexStr_abi_cxx11_((string *)local_188,s_00);
      pvVar11 = (iterator)0x2;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
                (&local_268,&local_350,0x1bc,1,2,psVar8,
                 "vec[\"intermediary\"][\"merkleRoot\"].get_str()",(string *)local_188,
                 "HexStr(spend_data.merkle_root)");
      std::__cxx11::string::~string((string *)local_188);
      std::__cxx11::string::~string((string *)local_168);
      std::__cxx11::string::~string((string *)&local_148);
    }
    local_360 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
    ;
    local_358 = "";
    local_370 = &boost::unit_test::basic_cstring<char_const>::null;
    local_368 = &boost::unit_test::basic_cstring<char_const>::null;
    msg_03.m_end = (iterator)psVar8;
    msg_03.m_begin = pvVar11;
    file_03.m_end = (iterator)0x1be;
    file_03.m_begin = (iterator)&local_360;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_370,
               msg_03);
    local_268._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    local_268._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
    local_268._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)boost::unit_test::lazy_ostream::inst;
    local_268._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)((long)"\x05\x04\x03\x02\x01" + 5);
    local_380 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
    ;
    local_378 = "";
    local_148._M_dataplus._M_p =
         (pointer)spend_data.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_168._0_8_ = scriptposes._M_t._M_impl.super__Rb_tree_header._M_node_count;
    in_R8 = (iterator)0x2;
    in_R9 = &local_148;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (&local_268,&local_380,0x1be,1,2,in_R9,"spend_data.scripts.size()",local_168,
               "scriptposes.size()");
    for (p_Var10 = scriptposes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var10 != &scriptposes._M_t._M_impl.super__Rb_tree_header;
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
      local_390 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
      ;
      local_388 = "";
      local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_398 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_04.m_end = (iterator)in_R9;
      msg_04.m_begin = in_R8;
      file_04.m_end = (iterator)0x1c0;
      file_04.m_begin = (iterator)&local_390;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3a0,
                 msg_04);
      __x = &std::
             map<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
             ::operator[](&spend_data.scripts,(key_type *)(p_Var10 + 1))->_M_t;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"expected",&local_2b9)
      ;
      pUVar6 = UniValue::operator[](this_00,&local_148);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_168,"scriptPathControlBlocks",&local_3a1);
      pUVar6 = UniValue::operator[](pUVar6,(string *)local_168);
      pUVar6 = UniValue::operator[](pUVar6,(long)(int)p_Var10[2]._M_color);
      psVar8 = UniValue::get_str_abi_cxx11_(pUVar6);
      hex_str_00._M_str = (psVar8->_M_dataplus)._M_p;
      hex_str_00._M_len = psVar8->_M_string_length;
      ParseHex<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8,hex_str_00);
      __l._M_len = 1;
      __l._M_array = (iterator)&local_1c8;
      std::
      set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::set((set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *)&local_268,__l,&local_3a2,&local_3a3);
      _cVar12 = 0x4b3e42;
      local_1a8._M_dataplus._M_p._0_1_ = std::operator==(__x,&local_268);
      local_1a8._M_string_length = 0;
      local_1a8.field_2._M_allocated_capacity = 0;
      local_3b8 = 
      "spend_data.scripts[scriptpos.first] == control_set{ParseHex(vec[\"expected\"][\"scriptPathControlBlocks\"][scriptpos.second].get_str())}"
      ;
      local_3b0 = "";
      bStack_180 = false;
      local_188 = (undefined1  [8])&PTR__lazy_ostream_0113a070;
      local_178[0] = boost::unit_test::lazy_ostream::inst;
      local_178[1] = (undefined1 *)&local_3b8;
      local_3c8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_standard_tests.cpp"
      ;
      local_3c0 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (string *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&local_1a8,(lazy_ostream *)local_188,1,0,WARN,_cVar12,
                 (size_t)&local_3c8,0x1c0);
      boost::detail::shared_count::~shared_count
                ((shared_count *)&local_1a8.field_2._M_allocated_capacity);
      std::
      _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~_Rb_tree(&local_268);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1c8);
      std::__cxx11::string::~string((string *)local_168);
      std::__cxx11::string::~string((string *)&local_148);
    }
    std::
    _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_ShortestVectorFirstComparator,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>_>
    ::~_Rb_tree(&spend_data.scripts._M_t);
    std::_Function_base::~_Function_base(&parse_tree.super__Function_base);
    std::
    _Rb_tree<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>,_std::_Select1st<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>,_std::less<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>,_std::allocator<std::pair<const_std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_int>_>_>
    ::~_Rb_tree(&scriptposes._M_t);
    std::
    vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ::~vector(&spktest.m_branch);
  }
  UniValue::~UniValue(&tests);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(bip341_spk_test_vectors)
{
    using control_set = decltype(TaprootSpendData::scripts)::mapped_type;

    UniValue tests;
    tests.read(json_tests::bip341_wallet_vectors);

    const auto& vectors = tests["scriptPubKey"];

    for (const auto& vec : vectors.getValues()) {
        TaprootBuilder spktest;
        std::map<std::pair<std::vector<unsigned char>, int>, int> scriptposes;
        std::function<void (const UniValue&, int)> parse_tree = [&](const UniValue& node, int depth) {
            if (node.isNull()) return;
            if (node.isObject()) {
                auto script = ParseHex(node["script"].get_str());
                int idx = node["id"].getInt<int>();
                int leaf_version = node["leafVersion"].getInt<int>();
                scriptposes[{script, leaf_version}] = idx;
                spktest.Add(depth, script, leaf_version);
            } else {
                parse_tree(node[0], depth + 1);
                parse_tree(node[1], depth + 1);
            }
        };
        parse_tree(vec["given"]["scriptTree"], 0);
        spktest.Finalize(XOnlyPubKey(ParseHex(vec["given"]["internalPubkey"].get_str())));
        BOOST_CHECK_EQUAL(HexStr(GetScriptForDestination(spktest.GetOutput())), vec["expected"]["scriptPubKey"].get_str());
        BOOST_CHECK_EQUAL(EncodeDestination(spktest.GetOutput()), vec["expected"]["bip350Address"].get_str());
        auto spend_data = spktest.GetSpendData();
        BOOST_CHECK_EQUAL(vec["intermediary"]["merkleRoot"].isNull(), spend_data.merkle_root.IsNull());
        if (!spend_data.merkle_root.IsNull()) {
            BOOST_CHECK_EQUAL(vec["intermediary"]["merkleRoot"].get_str(), HexStr(spend_data.merkle_root));
        }
        BOOST_CHECK_EQUAL(spend_data.scripts.size(), scriptposes.size());
        for (const auto& scriptpos : scriptposes) {
            BOOST_CHECK(spend_data.scripts[scriptpos.first] == control_set{ParseHex(vec["expected"]["scriptPathControlBlocks"][scriptpos.second].get_str())});
        }
    }
}